

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall mjs::lexer::next_token(lexer *this)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  uint32_t *puVar6;
  const_reference pvVar7;
  char *pcVar8;
  wchar_t *__str;
  ostream *poVar9;
  void *this_00;
  runtime_error *this_01;
  version in_R9D;
  wstring_view text_;
  wstring_view text__00;
  wstring_view text;
  wstring_view text_00;
  wstring_view text_01;
  wstring_view text_02;
  wstring_view s;
  classification local_4a9;
  bool local_481;
  string local_460 [48];
  ostringstream local_430 [8];
  ostringstream oss;
  undefined1 local_2b8 [80];
  undefined1 local_268 [80];
  undefined1 local_218 [80];
  undefined1 local_1c8 [80];
  token local_178;
  __tuple_element_t<1UL,_tuple<token_type,_int>_> *local_150;
  type *len;
  type *tok;
  version local_138;
  tuple<mjs::token_type,_int> local_130;
  undefined1 local_128 [64];
  undefined1 local_e8 [80];
  token local_98;
  undefined1 local_70 [80];
  size_t local_20;
  size_t token_end;
  lexer *plStack_10;
  int ch;
  lexer *this_local;
  
  sVar5 = this->text_pos_;
  plStack_10 = this;
  sVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(&this->text_);
  if (sVar5 == sVar4) {
    token::operator=(&this->current_token_,(token *)eof_token);
    return;
  }
  uVar1 = this->text_pos_;
  sVar5 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(&this->text_);
  if (sVar5 <= uVar1) {
    __assert_fail("text_pos_ < text_.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x22a,"void mjs::lexer::next_token()");
  }
  puVar6 = (uint32_t *)
           std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                     (&this->text_,this->text_pos_);
  token_end._4_4_ = *puVar6;
  local_20 = this->text_pos_ + 1;
  if ((token_end._4_4_ == 0x27) || (token_end._4_4_ == 0x22)) {
    local_70._16_8_ = (this->text_)._M_len;
    local_70._24_8_ = (this->text_)._M_str;
    text_._M_str = (wchar_t *)this->text_pos_;
    text_._M_len = local_70._24_8_;
    anon_unknown_2::get_string_literal
              ((pair<mjs::token,_unsigned_long> *)(local_70 + 0x20),
               (anon_unknown_2 *)local_70._16_8_,text_,(ulong)this->version_,in_R9D);
    std::tie<mjs::token,unsigned_long>((token *)local_70,(unsigned_long *)&this->current_token_);
    std::tuple<mjs::token&,unsigned_long&>::operator=
              ((tuple<mjs::token&,unsigned_long&> *)local_70,
               (pair<mjs::token,_unsigned_long> *)(local_70 + 0x20));
    std::pair<mjs::token,_unsigned_long>::~pair
              ((pair<mjs::token,_unsigned_long> *)(local_70 + 0x20));
    goto LAB_001d2310;
  }
  bVar3 = anon_unknown_2::is_line_terminator(token_end._4_4_,this->version_);
  if (bVar3) {
    while( true ) {
      sVar2 = local_20;
      sVar5 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(&this->text_);
      local_481 = false;
      if (sVar2 < sVar5) {
        pvVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                           (&this->text_,local_20);
        local_481 = anon_unknown_2::is_line_terminator(*pvVar7,this->version_);
      }
      if (local_481 == false) break;
      local_20 = local_20 + 1;
    }
    token::token(&local_98,line_terminator);
    token::operator=(&this->current_token_,&local_98);
    token::~token(&local_98);
    goto LAB_001d2310;
  }
  bVar3 = anon_unknown_2::is_digit(token_end._4_4_);
  sVar2 = local_20;
  if (bVar3) {
LAB_001d1c8a:
    local_e8._16_8_ = (this->text_)._M_len;
    local_e8._24_8_ = (this->text_)._M_str;
    text__00._M_str = (wchar_t *)this->text_pos_;
    text__00._M_len = local_e8._24_8_;
    anon_unknown_2::get_number_literal
              ((pair<mjs::token,_unsigned_long> *)(local_e8 + 0x20),
               (anon_unknown_2 *)local_e8._16_8_,text__00,(ulong)this->version_,in_R9D);
    std::tie<mjs::token,unsigned_long>((token *)local_e8,(unsigned_long *)&this->current_token_);
    std::tuple<mjs::token&,unsigned_long&>::operator=
              ((tuple<mjs::token&,unsigned_long&> *)local_e8,
               (pair<mjs::token,_unsigned_long> *)(local_e8 + 0x20));
    std::pair<mjs::token,_unsigned_long>::~pair
              ((pair<mjs::token,_unsigned_long> *)(local_e8 + 0x20));
  }
  else {
    if ((token_end._4_4_ == 0x2e) &&
       (sVar5 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(&this->text_),
       sVar2 < sVar5)) {
      pvVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         (&this->text_,local_20);
      bVar3 = anon_unknown_2::is_digit(*pvVar7);
      if (bVar3) goto LAB_001d1c8a;
    }
    pcVar8 = strchr("!%&()*+,-./:;<=>?[]^{|}~",token_end._4_4_);
    sVar2 = local_20;
    if (pcVar8 == (char *)0x0) {
      bVar3 = anon_unknown_2::is_whitespace_v1(token_end._4_4_);
      if ((bVar3) || ((1 < (int)this->version_ && (token_end._4_4_ == 0xfeff)))) {
        local_1c8._16_8_ = (this->text_)._M_len;
        local_1c8._24_8_ = (this->text_)._M_str;
        text._M_str = (wchar_t *)this->text_pos_;
        text._M_len = local_1c8._24_8_;
        anon_unknown_2::skip_whitespace
                  ((pair<mjs::token,_unsigned_long> *)(local_1c8 + 0x20),
                   (anon_unknown_2 *)local_1c8._16_8_,text,(ulong)this->version_,in_R9D);
        std::tie<mjs::token,unsigned_long>
                  ((token *)local_1c8,(unsigned_long *)&this->current_token_);
        std::tuple<mjs::token&,unsigned_long&>::operator=
                  ((tuple<mjs::token&,unsigned_long&> *)local_1c8,
                   (pair<mjs::token,_unsigned_long> *)(local_1c8 + 0x20));
        std::pair<mjs::token,_unsigned_long>::~pair
                  ((pair<mjs::token,_unsigned_long> *)(local_1c8 + 0x20));
      }
      else {
        bVar3 = anon_unknown_2::is_identifier_start_v1(token_end._4_4_);
        if ((bVar3) || ((0 < (int)this->version_ && (token_end._4_4_ == 0x5c)))) {
          local_218._16_8_ = (this->text_)._M_len;
          local_218._24_8_ = (this->text_)._M_str;
          text_00._M_str = (wchar_t *)this->text_pos_;
          text_00._M_len = local_218._24_8_;
          anon_unknown_2::get_identifier
                    ((pair<mjs::token,_unsigned_long> *)(local_218 + 0x20),
                     (anon_unknown_2 *)local_218._16_8_,text_00,(ulong)this->version_,in_R9D);
          std::tie<mjs::token,unsigned_long>
                    ((token *)local_218,(unsigned_long *)&this->current_token_);
          std::tuple<mjs::token&,unsigned_long&>::operator=
                    ((tuple<mjs::token&,unsigned_long&> *)local_218,
                     (pair<mjs::token,_unsigned_long> *)(local_218 + 0x20));
          std::pair<mjs::token,_unsigned_long>::~pair
                    ((pair<mjs::token,_unsigned_long> *)(local_218 + 0x20));
        }
        else {
          if ((int)this->version_ < 1) {
            local_4a9 = other;
          }
          else {
            local_4a9 = anon_unknown_2::classify(token_end._4_4_);
          }
          if (local_4a9 == id_start) {
            local_2b8._16_8_ = (this->text_)._M_len;
            local_2b8._24_8_ = (this->text_)._M_str;
            text_02._M_str = (wchar_t *)this->text_pos_;
            text_02._M_len = local_2b8._24_8_;
            anon_unknown_2::get_identifier
                      ((pair<mjs::token,_unsigned_long> *)(local_2b8 + 0x20),
                       (anon_unknown_2 *)local_2b8._16_8_,text_02,(ulong)this->version_,in_R9D);
            std::tie<mjs::token,unsigned_long>
                      ((token *)local_2b8,(unsigned_long *)&this->current_token_);
            std::tuple<mjs::token&,unsigned_long&>::operator=
                      ((tuple<mjs::token&,unsigned_long&> *)local_2b8,
                       (pair<mjs::token,_unsigned_long> *)(local_2b8 + 0x20));
            std::pair<mjs::token,_unsigned_long>::~pair
                      ((pair<mjs::token,_unsigned_long> *)(local_2b8 + 0x20));
          }
          else {
            if (local_4a9 != whitespace) {
              std::__cxx11::ostringstream::ostringstream(local_430);
              poVar9 = std::operator<<((ostream *)local_430,"Unhandled character in ");
              poVar9 = std::operator<<(poVar9,"next_token");
              poVar9 = std::operator<<(poVar9,": ");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,token_end._4_4_);
              poVar9 = std::operator<<(poVar9," 0x");
              this_00 = (void *)std::ostream::operator<<(poVar9,std::hex);
              poVar9 = (ostream *)std::ostream::operator<<(this_00,token_end._4_4_);
              std::operator<<(poVar9,"\n");
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::ostringstream::str();
              std::runtime_error::runtime_error(this_01,local_460);
              __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            local_268._16_8_ = (this->text_)._M_len;
            local_268._24_8_ = (this->text_)._M_str;
            text_01._M_str = (wchar_t *)this->text_pos_;
            text_01._M_len = local_268._24_8_;
            anon_unknown_2::skip_whitespace
                      ((pair<mjs::token,_unsigned_long> *)(local_268 + 0x20),
                       (anon_unknown_2 *)local_268._16_8_,text_01,(ulong)this->version_,in_R9D);
            std::tie<mjs::token,unsigned_long>
                      ((token *)local_268,(unsigned_long *)&this->current_token_);
            std::tuple<mjs::token&,unsigned_long&>::operator=
                      ((tuple<mjs::token&,unsigned_long&> *)local_268,
                       (pair<mjs::token,_unsigned_long> *)(local_268 + 0x20));
            std::pair<mjs::token,_unsigned_long>::~pair
                      ((pair<mjs::token,_unsigned_long> *)(local_268 + 0x20));
          }
        }
      }
    }
    else if (((token_end._4_4_ == 0x2f) &&
             (sVar5 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                                (&this->text_), sVar2 < sVar5)) &&
            ((pvVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                                 (&this->text_,local_20), *pvVar7 == 0x2f ||
             (pvVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                                 (&this->text_,local_20), *pvVar7 == 0x2a)))) {
      anon_unknown_2::skip_comment
                ((pair<mjs::token,_unsigned_long> *)(local_128 + 0x10),&this->text_,local_20,
                 this->version_);
      std::tie<mjs::token,unsigned_long>((token *)local_128,(unsigned_long *)&this->current_token_);
      std::tuple<mjs::token&,unsigned_long&>::operator=
                ((tuple<mjs::token&,unsigned_long&> *)local_128,
                 (pair<mjs::token,_unsigned_long> *)(local_128 + 0x10));
      std::pair<mjs::token,_unsigned_long>::~pair
                ((pair<mjs::token,_unsigned_long> *)(local_128 + 0x10));
    }
    else {
      __str = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                        (&this->text_,this->text_pos_);
      sVar5 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(&this->text_);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&tok,__str,
                 sVar5 - this->text_pos_);
      s._M_str = (wchar_t *)tok;
      s._M_len = (size_t)&local_130;
      anon_unknown_2::get_punctuation(s,local_138);
      len = (type *)std::get<0ul,mjs::token_type,int>(&local_130);
      local_150 = std::get<1ul,mjs::token_type,int>(&local_130);
      local_20 = this->text_pos_ + (long)*local_150;
      token::token(&local_178,*len);
      token::operator=(&this->current_token_,&local_178);
      token::~token(&local_178);
    }
  }
LAB_001d2310:
  this->text_pos_ = local_20;
  return;
}

Assistant:

void lexer::next_token() {
    if (text_pos_ == text_.size()) {
        current_token_ = eof_token;
        return;
    }
    assert(text_pos_ < text_.size());

    const int ch = text_[text_pos_];
    size_t token_end = text_pos_ + 1;

    if (ch == '\''  || ch == '\"') {
        std::tie(current_token_, token_end) = get_string_literal(text_, text_pos_, version_);
    } else if (is_line_terminator(ch, version_)) {
        while (token_end < text_.size() && is_line_terminator(text_[token_end], version_)) {
            ++token_end;
        }
        current_token_  = token{token_type::line_terminator};
    } else if (is_digit(ch) || (ch == '.' && token_end < text_.size() && is_digit(text_[token_end]))) {
        std::tie(current_token_, token_end) = get_number_literal(text_, text_pos_, version_);
    } else if (std::strchr("!%&()*+,-./:;<=>?[]^{|}~", ch)) {
        if (ch == '/' && token_end < text_.size() && (text_[token_end] == '/' || text_[token_end] == '*')) {
            std::tie(current_token_, token_end)  = skip_comment(text_, token_end, version_);
        } else {
            auto [tok, len] = get_punctuation(std::wstring_view{&text_[text_pos_], text_.size() - text_pos_}, version_);
            token_end = text_pos_ + len;
            current_token_ = token{tok};
        }
    } else if (is_whitespace_v1(ch) || (version_ >= version::es5 && ch == unicode_BOM)) {
        std::tie(current_token_, token_end) = skip_whitespace(text_, text_pos_, version_);
    } else if (is_identifier_start_v1(ch) || (version_ >= version::es3 && ch == '\\')) {
        std::tie(current_token_, token_end) = get_identifier(text_, text_pos_, version_);
    } else {
        // Do more expensive classification
        switch (version_ >= version::es3 ? classify(ch) : unicode::classification::other) {
        case unicode::classification::whitespace:
            std::tie(current_token_, token_end) = skip_whitespace(text_, text_pos_, version_);
            break;
        case unicode::classification::id_start:
            std::tie(current_token_, token_end) = get_identifier(text_, text_pos_, version_);
            break;
        default:
            std::ostringstream oss;
            oss << "Unhandled character in " << __FUNCTION__ << ": " << ch << " 0x" << std::hex << (int)ch << "\n";
            throw std::runtime_error(oss.str());
        }
    }

    text_pos_ = token_end;
}